

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O3

void __thiscall
duckdb::Serializer::WriteValue<duckdb::PersistentColumnData>
          (Serializer *this,vector<duckdb::PersistentColumnData,_true> *vec)

{
  pointer pPVar1;
  PersistentColumnData *item;
  pointer this_00;
  
  (*this->_vptr_Serializer[8])
            (this,(long)(vec->
                        super_vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
                        ).
                        super__Vector_base<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(vec->
                        super_vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
                        ).
                        super__Vector_base<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 6);
  pPVar1 = (vec->
           super_vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
           ).
           super__Vector_base<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (vec->
                 super_vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
                 ).
                 super__Vector_base<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pPVar1; this_00 = this_00 + 1
      ) {
    (*this->_vptr_Serializer[6])(this);
    PersistentColumnData::Serialize(this_00,this);
    (*this->_vptr_Serializer[7])(this);
  }
  (*this->_vptr_Serializer[9])(this);
  return;
}

Assistant:

void WriteValue(const vector<T> &vec) {
		auto count = vec.size();
		OnListBegin(count);
		for (auto &item : vec) {
			WriteValue(item);
		}
		OnListEnd();
	}